

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O3

void __thiscall
t_cl_generator::generate_cl_struct
          (t_cl_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ostream *poVar6;
  long *plVar7;
  undefined7 in_register_00000009;
  size_type sVar8;
  char *pcVar9;
  t_cl_generator *this_00;
  string name;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  undefined1 local_50 [32];
  
  type_name_abi_cxx11_((string *)local_50,this,&tstruct->super_t_type);
  pcVar9 = "(thrift:def-struct ";
  if ((int)CONCAT71(in_register_00000009,is_exception) != 0) {
    pcVar9 = "(thrift:def-exception ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,pcVar9,(CONCAT71(in_register_00000009,is_exception) & 0xffffffff) * 3 + 0x13);
  this_00 = (t_cl_generator *)local_50._0_8_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._0_8_,(pointer)(local_50._0_8_ + local_50._8_8_));
  prefix(&local_b0,this_00,&local_70);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((tstruct->super_t_type).super_t_doc.has_doc_ == true) {
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
    pcVar3 = (tstruct->super_t_type).super_t_doc.doc_._M_dataplus._M_p;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,
               pcVar3 + (tstruct->super_t_type).super_t_doc.doc_._M_string_length);
    sVar4 = local_88;
    if (local_88 != 0) {
      sVar8 = 0;
      do {
        if (local_90->_M_local_buf[sVar8] == '\"') {
          local_90->_M_local_buf[sVar8] = '\'';
        }
        sVar8 = sVar8 + 1;
      } while (local_88 != sVar8);
    }
    if (local_90 == &local_80) {
      local_b0.field_2._8_8_ = local_80._8_8_;
      local_90 = paVar2;
    }
    local_b0._M_string_length = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)local_90;
    paVar5 = local_90;
    local_90 = &local_80;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,paVar5->_M_local_buf,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
  }
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  generate_cl_struct_internal(this,out,tstruct,false);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + (char)out);
  std::ostream::put((char)out);
  plVar7 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  if ((t_cl_generator *)local_50._0_8_ != (t_cl_generator *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  return;
}

Assistant:

void t_cl_generator::generate_cl_struct(std::ostream& out, t_struct* tstruct, bool is_exception = false) {
  std::string name = type_name(tstruct);
  out << (is_exception ? "(thrift:def-exception " : "(thrift:def-struct ") <<
      prefix(name) << endl;
  indent_up();
  if ( tstruct->has_doc() ) {
    out << indent() ;
    out << "\"" << cl_docstring(tstruct->get_doc()) << "\"" << endl;
  }
  out << indent() ;
  generate_cl_struct_internal(out, tstruct, is_exception);
  indent_down();
  out << ")" << endl << endl;
}